

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::PixelPackBufferStorageTestCase::execute
          (PixelPackBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  GLenum GVar5;
  void *pvVar6;
  uchar *puVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uchar *puVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  int iVar16;
  void *pvVar17;
  ulong uVar18;
  bool bVar19;
  byte local_1ca;
  byte local_1c9;
  PixelPackBufferStorageTestCase *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  (*this->m_gl->bindBuffer)(0x88eb,this->m_sparse_bo);
  GVar5 = (*this->m_gl->getError)();
  glu::checkError(GVar5,"glBindBuffer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xc16);
  iVar16 = 0;
  local_1c9 = 1;
  local_1c8 = this;
  do {
    if (iVar16 != 2) {
      if (iVar16 == 1) {
        uVar12 = this->m_ref_data_size / (uint)this->m_page_size;
        if (uVar12 != 0xffffffff) {
          uVar10 = 0;
          do {
            (*this->m_gl->bufferPageCommitmentARB)
                      (0x88eb,(ulong)(this->m_page_size * uVar10),(long)this->m_page_size,
                       ~(byte)uVar10 & 1);
            GVar5 = (*this->m_gl->getError)();
            glu::checkError(GVar5,"glBufferPageCommitmentARB() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                            ,0xc3a);
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar12 + 1);
        }
      }
      else {
        (*this->m_gl->bufferPageCommitmentARB)
                  (0x88eb,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
        GVar5 = (*this->m_gl->getError)();
        glu::checkError(GVar5,"glBufferPageCommitmentARB() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xc29);
      }
    }
    (*this->m_gl->useProgram)(this->m_po);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc50);
    (*this->m_gl->drawArrays)(5,0,4);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glDrawArrays() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc53);
    (*this->m_gl->readPixels)
              (0,0,this->m_color_rb_width,this->m_color_rb_height,0x1908,0x1401,(void *)0x0);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glReadPixels() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc59);
    (*this->m_gl->copyBufferSubData)(0x88eb,0x8f36,0,0,(ulong)this->m_ref_data_size);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glCopyBufferSubData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc5e);
    pvVar6 = (*this->m_gl->mapBufferRange)(0x8f36,0,(ulong)this->m_ref_data_size,1);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glMapBufferRange() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc63);
    uVar12 = this->m_color_rb_height;
    if (uVar12 == 0) {
      bVar8 = 1;
    }
    else {
      puVar11 = this->m_ref_data_ptr;
      uVar13 = (ulong)this->m_color_rb_width;
      uVar15 = 0;
      uVar10 = 0;
      bVar14 = 1;
      do {
        bVar8 = bVar14;
        if ((bool)((int)uVar13 != 0 & bVar14)) {
          if (bVar14 == 0) {
            bVar14 = 0;
          }
          else {
            uVar13 = (ulong)this->m_color_rb_width;
            uVar18 = 0;
            do {
              uVar12 = uVar10;
              local_1b8 = uVar18;
              pvVar17 = pvVar6;
              puVar7 = puVar11;
              uVar18 = 0;
              do {
                if ((iVar16 != 2) &&
                   ((iVar16 != 1 ||
                    (((uVar18 + uVar12 & 0xffffffff) / (ulong)(uint)this->m_page_size & 1) == 0))))
                {
                  bVar2 = puVar7[uVar18];
                  iVar9 = (uint)bVar2 - (uint)*(byte *)((long)pvVar17 + uVar18);
                  bVar3 = (byte)iVar9;
                  bVar4 = -bVar3;
                  if (0 < iVar9) {
                    bVar4 = bVar3;
                  }
                  if (1 < bVar4) {
                    local_1b0 = (undefined1  [8])local_1c8->m_testCtx->m_log;
                    local_1c0 = uVar15;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"Invalid texel data (channel:",0x1c);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,") found at X:",0xd);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,", Y:",4);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"). Expected value:",0x12);
                    local_1ca = bVar2;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)&local_1ca,1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,", found value:",0xe);
                    local_1ca = puVar7[uVar18];
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)&local_1ca,1);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                    uVar10 = (int)uVar18 + uVar12 + 1;
                    pvVar6 = (void *)((long)pvVar17 + uVar18 + 1);
                    puVar11 = puVar7 + uVar18 + 1;
                    uVar13 = (ulong)local_1c8->m_color_rb_width;
                    bVar14 = 0;
                    uVar15 = local_1c0;
                    this = local_1c8;
                    bVar8 = 0;
                    goto LAB_00a47fed;
                  }
                }
                uVar1 = uVar18 + 1;
              } while ((uVar18 < 3) && (uVar18 = uVar1, bVar14 != 0));
              uVar18 = local_1b8 + 1;
              if (uVar13 <= uVar18 || (bVar14 ^ 1) != 0) break;
              puVar11 = puVar7 + uVar1;
              pvVar6 = (void *)(uVar1 + (long)pvVar17);
              uVar10 = (int)uVar1 + uVar12;
            } while (bVar14 != 0);
            bVar14 = (uVar13 <= uVar18 | bVar14 ^ 1) & bVar14;
            puVar11 = puVar7 + uVar1;
            pvVar6 = (void *)((long)pvVar17 + uVar1);
            uVar10 = uVar12 + (int)uVar1;
            this = local_1c8;
          }
LAB_00a47fed:
          uVar12 = this->m_color_rb_height;
        }
        uVar15 = uVar15 + 1;
      } while ((uVar15 < uVar12) && (bVar19 = bVar14 != 0, bVar14 = bVar8, bVar19));
    }
    local_1c9 = local_1c9 & bVar8;
    (*this->m_gl->unmapBuffer)(0x8f36);
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xc99);
    (*this->m_gl->bufferPageCommitmentARB)(0x88eb,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar5 = (*this->m_gl->getError)();
    glu::checkError(GVar5,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xca1);
    iVar16 = iVar16 + 1;
    if (iVar16 == 3) {
      return (bool)(local_1c9 & 1);
    }
  } while( true );
}

Assistant:

bool PixelPackBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	m_gl.bindBuffer(GL_PIXEL_PACK_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed.");

	/* Run three separate iterations:
	 *
	 * a) All pages that are going to hold the texture data are committed.
	 * b) Use a zig-zag memory page commitment layout patern.
	 * b) No pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the memory page commitment & the storage contents*/
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, 0,			 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			break;
		}

		case 1:
		{
			const unsigned int n_pages = 1 + m_ref_data_size / m_page_size;

			DE_ASSERT((m_ref_data_size % m_page_size) == 0);

			for (unsigned int n_page = 0; n_page < n_pages; ++n_page)
			{
				const bool should_commit = ((n_page % 2) == 0);

				m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, m_page_size * n_page, m_page_size,
											 should_commit ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
			} /* for (all relevant memory pages) */

			break;
		}

		case 2:
		{
			/* Do nothing - all pages already de-committed  */
			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		/* Draw full screen quad to generate the black-to-white gradient */
		const unsigned char* read_data_ptr = NULL;

		m_gl.useProgram(m_po);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

		m_gl.drawArrays(GL_TRIANGLE_STRIP, 0 /* first */, 4 /* count */);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDrawArrays() call failed.");

		/* Read a framebuffer pixel data */
		m_gl.readPixels(0,																	/* x */
						0,																	/* y */
						m_color_rb_width, m_color_rb_height, GL_RGBA, GL_UNSIGNED_BYTE, 0); /* pixels */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glReadPixels() call failed.");

		m_gl.copyBufferSubData(GL_PIXEL_PACK_BUFFER, GL_COPY_READ_BUFFER, 0, /* readOffset */
							   0,											 /* writeOffset */
							   m_ref_data_size);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

		read_data_ptr = (unsigned char*)m_gl.mapBufferRange(GL_COPY_READ_BUFFER, 0, /* offset */
															m_ref_data_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

		/* Verify the data */
		unsigned int		 n_current_tex_data_byte	  = 0;
		const unsigned char* read_data_traveller_ptr	  = (const unsigned char*)read_data_ptr;
		const unsigned char* reference_data_traveller_ptr = (const unsigned char*)m_ref_data_ptr;

		for (unsigned int y = 0; y < m_color_rb_height && result_local; ++y)
		{
			for (unsigned int x = 0; x < m_color_rb_width && result_local; ++x)
			{
				for (unsigned int n_component = 0; n_component < 4 /* rgba */ && result_local; ++n_component)
				{
					unsigned char expected_value		 = 0;
					bool		  is_from_committed_page = true;

					if (n_iteration == 1) /* zig-zag */
					{
						is_from_committed_page = ((n_current_tex_data_byte / m_page_size) % 2) == 0;
					}
					else if (n_iteration == 2) /* no pages committed */
					{
						is_from_committed_page = false;
					}

					if (is_from_committed_page)
					{
						expected_value = *reference_data_traveller_ptr;
					}

					if (is_from_committed_page && de::abs(expected_value - *read_data_traveller_ptr) > 1)
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel data (channel:" << n_component
										   << ")"
											  " found at X:"
										   << x << ", "
												   "Y:"
										   << y << ")."
												   " Expected value:"
										   << expected_value << ","
																" found value:"
										   << *reference_data_traveller_ptr << tcu::TestLog::EndMessage;

						result_local = false;
					}

					n_current_tex_data_byte++;
					read_data_traveller_ptr++;
					reference_data_traveller_ptr++;
				} /* for (all components) */
			}	 /* for (all columns) */
		}		  /* for (all rows) */

		m_gl.unmapBuffer(GL_COPY_READ_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");

		read_data_ptr = DE_NULL;
		result &= result_local;

		/* Clean up */
		m_gl.bufferPageCommitmentARB(GL_PIXEL_PACK_BUFFER, 0,			  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}